

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O0

int __thiscall
unodb::detail::
basic_inode_4<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
::init(basic_inode_4<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
       *this,EVP_PKEY_CTX *ctx)

{
  byte key2;
  byte key1;
  uint uVar1;
  byte bVar2;
  value_type vVar3;
  int extraout_EAX;
  pointer this_00;
  reference peVar4;
  uint in_EDX;
  inode<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *in_R8;
  unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  local_70;
  node_ptr local_60;
  key_view local_58;
  byte local_46;
  byte local_45;
  uint local_44;
  byte new_key_byte;
  byte source_node_key_byte;
  key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
  *pkStack_40;
  uint diff_key_byte_i;
  key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
  *source_key_prefix;
  inode<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *source_inode;
  db_leaf_unique_ptr *child1_local;
  basic_inode_4<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
  *pbStack_20;
  uint shared_prefix_len_local;
  basic_inode_4<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
  *this_local;
  basic_node_ptr<unodb::detail::node_header> bStack_10;
  tree_depth_type depth_local;
  node_ptr source_node_local;
  
  source_inode = in_R8;
  child1_local._4_4_ = in_EDX;
  pbStack_20 = this;
  bStack_10.tagged_ptr = (uintptr_t)ctx;
  source_key_prefix =
       (key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
        *)basic_node_ptr<unodb::detail::node_header>::
          ptr<unodb::detail::inode<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>*>
                    (&stack0xfffffffffffffff0);
  pkStack_40 = basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
               ::get_key_prefix((basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                                 *)&source_key_prefix->f);
  uVar1 = child1_local._4_4_;
  bVar2 = key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
          ::length((key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
                    *)&pkStack_40->f);
  if (uVar1 < bVar2) {
    vVar3 = tree_depth::operator_cast_to_unsigned_int((tree_depth *)((long)&this_local + 4));
    local_44 = vVar3 + child1_local._4_4_;
    local_45 = key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
               ::operator[]((key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
                             *)&pkStack_40->f,(ulong)child1_local._4_4_);
    key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
    ::cut((key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
           *)&pkStack_40->f,(char)child1_local._4_4_ + '\x01');
    this_00 = std::
              unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
              ::operator->((unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                            *)source_inode);
    local_58 = basic_leaf<unsigned_long,_unodb::detail::node_header>::get_key_view(this_00);
    peVar4 = std::span<const_std::byte,_18446744073709551615UL>::operator[]
                       (&local_58,(ulong)local_44);
    key1 = local_45;
    key2 = *peVar4;
    local_60.tagged_ptr = bStack_10.tagged_ptr;
    local_46 = key2;
    std::
    unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ::unique_ptr(&local_70,
                 (unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                  *)source_inode);
    add_two_to_empty(this,key1,local_60,key2,&local_70);
    std::
    unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ::~unique_ptr(&local_70);
    return extraout_EAX;
  }
  __assert_fail("shared_prefix_len < source_key_prefix.length()",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                ,0x527,
                "void unodb::detail::basic_inode_4<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>>::init(node_ptr, unsigned int, tree_depth_type, db_leaf_unique_ptr &&) [ArtPolicy = unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>]"
               );
}

Assistant:

constexpr void init(node_ptr source_node, unsigned shared_prefix_len,
                      tree_depth_type depth, db_leaf_unique_ptr &&child1) {
    auto *const source_inode{source_node.template ptr<inode_type *>()};
    auto &source_key_prefix = source_inode->get_key_prefix();
    UNODB_DETAIL_ASSERT(shared_prefix_len < source_key_prefix.length());

    const auto diff_key_byte_i = depth + shared_prefix_len;
    const auto source_node_key_byte = source_key_prefix[shared_prefix_len];
    source_key_prefix.cut(static_cast<key_prefix_size>(shared_prefix_len) + 1U);
    const auto new_key_byte = child1->get_key_view()[diff_key_byte_i];
    add_two_to_empty(source_node_key_byte, source_node, new_key_byte,
                     std::move(child1));
  }